

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-tool.cc
# Opt level: O0

void __thiscall string_parser::do_read(string_parser *this,bool append,bool null_term)

{
  ssize_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  int *piVar2;
  char *__rhs;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_18;
  char local_13;
  byte local_12;
  byte local_11;
  int r;
  char c;
  bool null_term_local;
  bool append_local;
  string_parser *this_local;
  
  local_12 = null_term;
  local_11 = append;
  _r = this;
  while( true ) {
    if (this->_end <= this->_offset) {
      return;
    }
    sVar1 = pread(this->_fd,&local_13,1,this->_offset);
    local_18 = (int)sVar1;
    if (local_18 != 1) break;
    if ((local_13 == '\0') != (bool)(local_12 & 1)) {
      return;
    }
    if ((local_11 & 1) != 0) {
      std::__cxx11::string::operator+=((string *)&this->_str,local_13);
    }
    this->_offset = this->_offset + 1;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"read failed: ",&local_39);
  piVar2 = __errno_location();
  __rhs = strerror(*piVar2);
  std::operator+(__return_storage_ptr__,&local_38,__rhs);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void do_read(bool append, bool null_term)
	{
		// std::cout << "READ: @" << std::hex << _offset << " append " << append << " null_term " << null_term << "\n";
		for (;_offset < _end; _offset++) {
			char c;
			int r = pread(_fd, &c, 1, _offset);
			if (r != 1)
				throw std::string("read failed: ") + strerror(errno);

			// std::cout << "READ: " << (isprint(c) ? c : '.') << " " << int(c) << " @" << std::hex << _offset <<"\n";

			if ((c == '\0') ^ null_term)
				return;

			if (append)
				_str += c;
		}
	}